

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.h
# Opt level: O3

void __thiscall
Js::JavascriptExceptionObject::JavascriptExceptionObject
          (JavascriptExceptionObject *this,Var object,ScriptContext *scriptContext,
          JavascriptExceptionContext *exceptionContextIn,bool isPendingExceptionObject)

{
  Type *addr;
  Type *pTVar1;
  JavascriptFunction *pJVar2;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  
  Memory::Recycler::WBSetBit((char *)this);
  (this->thrownObject).ptr = object;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  Memory::Recycler::WBSetBit((char *)&this->scriptContext);
  (this->scriptContext).ptr = scriptContext;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->scriptContext);
  this->byteCodeOffsetAfterDebuggerSkip = -1;
  this->field_0x14 = (isPendingExceptionObject * '\x02' | this->field_0x14 & 0x80) + 1;
  addr = &this->exceptionContext;
  this->hostWrapperCreateFunc = (Type)0x0;
  (this->exceptionContext).m_throwingFunction.ptr = (JavascriptFunction *)0x0;
  (this->exceptionContext).m_throwingFunctionByteCodeOffset = 0;
  (this->exceptionContext).m_stackTrace.ptr =
       (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  (this->exceptionContext).m_originalStackTrace.ptr =
       (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  (this->stackBackTrace).ptr = (StackBackTrace *)0x0;
  (this->next).ptr = (JavascriptExceptionObject *)0x0;
  if (exceptionContextIn == (JavascriptExceptionContext *)0x0) {
    (this->exceptionContext).m_stackTrace.ptr =
         (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    (this->exceptionContext).m_originalStackTrace.ptr =
         (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    (addr->m_throwingFunction).ptr = (JavascriptFunction *)0x0;
    *(undefined8 *)&(this->exceptionContext).m_throwingFunctionByteCodeOffset = 0;
  }
  else {
    pTVar1 = &(this->exceptionContext).m_stackTrace;
    pJVar2 = (exceptionContextIn->m_throwingFunction).ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->exceptionContext).m_throwingFunction.ptr = pJVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    (this->exceptionContext).m_throwingFunctionByteCodeOffset =
         exceptionContextIn->m_throwingFunctionByteCodeOffset;
    pLVar3 = (exceptionContextIn->m_stackTrace).ptr;
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->exceptionContext).m_stackTrace.ptr = pLVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
    pTVar1 = &(this->exceptionContext).m_originalStackTrace;
    pLVar3 = (exceptionContextIn->m_originalStackTrace).ptr;
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->exceptionContext).m_originalStackTrace.ptr = pLVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  }
  (this->stackBackTrace).ptr = (StackBackTrace *)0x0;
  return;
}

Assistant:

JavascriptExceptionObject(Var object, ScriptContext * scriptContext, JavascriptExceptionContext* exceptionContextIn, bool isPendingExceptionObject = false) :
            thrownObject(object),
            isPendingExceptionObject(isPendingExceptionObject),
            scriptContext(scriptContext), tag(true),
#ifdef ENABLE_SCRIPT_DEBUGGING
            isDebuggerSkip(false), byteCodeOffsetAfterDebuggerSkip(Constants::InvalidByteCodeOffset), hasDebuggerLogged(false),
            isFirstChance(false), isExceptionCaughtInNonUserCode(false), ignoreAdvanceToNextStatement(false),
#endif
            hostWrapperCreateFunc(nullptr),
            next(nullptr)
        {
            if (exceptionContextIn)
            {
                exceptionContext = *exceptionContextIn;
            }
            else
            {
                memset(&exceptionContext, 0, sizeof(exceptionContext));
            }
#if ENABLE_DEBUG_STACK_BACK_TRACE
            this->stackBackTrace = nullptr;
#endif
        }